

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O3

void __thiscall leveldb::anon_unknown_0::MergingIterator::FindSmallest(MergingIterator *this)

{
  undefined8 *puVar1;
  IteratorWrapper *pIVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  IteratorWrapper *pIVar6;
  IteratorWrapper *pIVar7;
  long in_FS_OFFSET;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = this->n_;
  if (iVar3 < 1) {
    pIVar7 = (IteratorWrapper *)0x0;
  }
  else {
    lVar5 = 0;
    lVar4 = 0;
    pIVar6 = (IteratorWrapper *)0x0;
    do {
      pIVar2 = this->children_;
      pIVar7 = pIVar6;
      if (((&pIVar2->valid_)[lVar5] == true) &&
         (pIVar7 = (IteratorWrapper *)((long)&pIVar2->iter_ + lVar5),
         pIVar6 != (IteratorWrapper *)0x0)) {
        puVar1 = (undefined8 *)((long)&(pIVar2->key_).data_ + lVar5);
        local_48 = *puVar1;
        uStack_40 = puVar1[1];
        if (pIVar6->valid_ == false) {
          __assert_fail("Valid()",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/table/iterator_wrapper.h"
                        ,0x27,"Slice leveldb::IteratorWrapper::key() const");
        }
        local_58 = *(undefined4 *)&(pIVar6->key_).data_;
        uStack_54 = *(undefined4 *)((long)&(pIVar6->key_).data_ + 4);
        uStack_50 = (undefined4)(pIVar6->key_).size_;
        uStack_4c = *(undefined4 *)((long)&(pIVar6->key_).size_ + 4);
        iVar3 = (*this->comparator_->_vptr_Comparator[2])(this->comparator_,&local_48,&local_58);
        if (iVar3 < 0) {
          pIVar6 = pIVar7;
        }
        iVar3 = this->n_;
        pIVar7 = pIVar6;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x20;
      pIVar6 = pIVar7;
    } while (lVar4 < iVar3);
  }
  this->current_ = pIVar7;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void MergingIterator::FindSmallest() {
  IteratorWrapper* smallest = nullptr;
  for (int i = 0; i < n_; i++) {
    IteratorWrapper* child = &children_[i];
    if (child->Valid()) {
      if (smallest == nullptr) {
        smallest = child;
      } else if (comparator_->Compare(child->key(), smallest->key()) < 0) {
        smallest = child;
      }
    }
  }
  current_ = smallest;
}